

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

Cord __thiscall
absl::lts_20250127::Cord::ChunkIterator::AdvanceAndReadBytes(ChunkIterator *this,size_t n)

{
  ulong chunk_size;
  uint8_t uVar1;
  Nonnull<char_*> __dest;
  CordRep *pCVar2;
  CordRepSubstring *pCVar3;
  CordRepExternal *pCVar4;
  CordRepFlat *pCVar5;
  uint8_t *puVar6;
  ulong in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *pcVar7;
  basic_string_view<char,_std::char_traits<char>_> src;
  string_view sVar8;
  Cord CVar9;
  CordRep *rep;
  
  if (*(ulong *)(n + 0x18) < in_RDX) {
    __assert_fail("false && \"bytes_remaining_ >= n && \\\"Attempted to iterate past `end()`\\\"\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                  ,0x441,
                  "auto absl::Cord::ChunkIterator::AdvanceAndReadBytes(size_t)::(anonymous class)::operator()() const"
                 );
  }
  (this->current_chunk_)._M_len = 0;
  (this->current_chunk_)._M_str = (char *)0x0;
  if (in_RDX < 0x10) {
    __dest = InlineRep::set_data((InlineRep *)this,in_RDX);
    while( true ) {
      if (in_RDX <= *(ulong *)n) break;
      memcpy(__dest,*(void **)(n + 8),*(ulong *)n);
      __dest = __dest + *(long *)n;
      in_RDX = in_RDX - *(long *)n;
      operator++((ChunkIterator *)n);
    }
    memcpy(__dest,*(void **)(n + 8),in_RDX);
    if (in_RDX < *(ulong *)n) {
      RemoveChunkPrefix((ChunkIterator *)n,in_RDX);
      pcVar7 = extraout_RDX_01;
    }
    else {
      pcVar7 = extraout_RDX_00;
      if (in_RDX != 0) {
        operator++((ChunkIterator *)n);
        pcVar7 = extraout_RDX_03;
      }
    }
  }
  else if (((long)*(int *)(n + 0x28) < 0) ||
          (*(long *)(n + 0x38 + (long)*(int *)(n + 0x28) * 8) == 0)) {
    pCVar2 = *(CordRep **)(n + 0x10);
    if (pCVar2 == (CordRep *)0x0) {
      __assert_fail("current_leaf_ != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                    ,0x46a,"Cord absl::Cord::ChunkIterator::AdvanceAndReadBytes(size_t)");
    }
    if (pCVar2->length == in_RDX) {
      *(undefined8 *)(n + 0x18) = 0;
      *(undefined8 *)n = 0;
      *(undefined8 *)(n + 8) = 0;
      pCVar2 = cord_internal::CordRep::Ref(pCVar2);
      VerifyTree(pCVar2);
      InlineRep::EmplaceTree((InlineRep *)this,pCVar2,kCordReader);
      pcVar7 = extraout_RDX_02;
    }
    else {
      uVar1 = pCVar2->tag;
      if (uVar1 == '\x01') {
        pCVar3 = cord_internal::CordRep::substring(pCVar2);
        pCVar2 = pCVar3->child;
        uVar1 = pCVar2->tag;
      }
      if (uVar1 == '\x05') {
        pCVar4 = cord_internal::CordRep::external(pCVar2);
        puVar6 = (uint8_t *)pCVar4->base;
      }
      else {
        pCVar5 = cord_internal::CordRep::flat(pCVar2);
        puVar6 = (pCVar5->super_CordRep).storage;
      }
      pCVar2 = cord_internal::CordRepSubstring::Substring
                         (pCVar2,*(long *)(n + 8) - (long)puVar6,in_RDX);
      VerifyTree(pCVar2);
      InlineRep::EmplaceTree((InlineRep *)this,pCVar2,kCordReader);
      *(long *)(n + 0x18) = *(long *)(n + 0x18) - in_RDX;
      *(long *)(n + 8) = *(long *)(n + 8) + in_RDX;
      *(ulong *)n = *(long *)n - in_RDX;
      pcVar7 = extraout_RDX_05;
    }
  }
  else {
    chunk_size = *(ulong *)n;
    if (in_RDX < 0x200 && in_RDX <= chunk_size) {
      src = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)n,0,in_RDX);
      Cord((Cord *)&rep,src,kCordReader);
      InlineRep::operator=((InlineRep *)this,(InlineRep *)&rep);
      ~Cord((Cord *)&rep);
      if (in_RDX < chunk_size) {
        *(long *)(n + 8) = *(long *)(n + 8) + in_RDX;
        *(ulong *)n = *(long *)n - in_RDX;
        pcVar7 = extraout_RDX;
      }
      else {
        sVar8 = cord_internal::CordRepBtreeReader::Next((CordRepBtreeReader *)(n + 0x20));
        pcVar7 = sVar8._M_str;
        *(string_view *)n = sVar8;
      }
    }
    else {
      sVar8 = cord_internal::CordRepBtreeReader::Read
                        ((CordRepBtreeReader *)(n + 0x20),in_RDX,chunk_size,&rep);
      *(string_view *)n = sVar8;
      InlineRep::EmplaceTree((InlineRep *)this,rep,kCordReader);
      pcVar7 = extraout_RDX_04;
    }
    *(long *)(n + 0x18) = *(long *)(n + 0x18) - in_RDX;
  }
  CVar9.contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)pcVar7;
  CVar9.contents_.data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)this;
  return (Cord)CVar9.contents_.data_.rep_.field_0;
}

Assistant:

Cord Cord::ChunkIterator::AdvanceAndReadBytes(size_t n) {
  ABSL_HARDENING_ASSERT(bytes_remaining_ >= n &&
                        "Attempted to iterate past `end()`");
  Cord subcord;
  auto constexpr method = CordzUpdateTracker::kCordReader;

  if (n <= InlineRep::kMaxInline) {
    // Range to read fits in inline data. Flatten it.
    char* data = subcord.contents_.set_data(n);
    while (n > current_chunk_.size()) {
      memcpy(data, current_chunk_.data(), current_chunk_.size());
      data += current_chunk_.size();
      n -= current_chunk_.size();
      ++*this;
    }
    memcpy(data, current_chunk_.data(), n);
    if (n < current_chunk_.size()) {
      RemoveChunkPrefix(n);
    } else if (n > 0) {
      ++*this;
    }
    return subcord;
  }

  if (btree_reader_) {
    size_t chunk_size = current_chunk_.size();
    if (n <= chunk_size && n <= kMaxBytesToCopy) {
      subcord = Cord(current_chunk_.substr(0, n), method);
      if (n < chunk_size) {
        current_chunk_.remove_prefix(n);
      } else {
        current_chunk_ = btree_reader_.Next();
      }
    } else {
      CordRep* rep;
      current_chunk_ = btree_reader_.Read(n, chunk_size, rep);
      subcord.contents_.EmplaceTree(rep, method);
    }
    bytes_remaining_ -= n;
    return subcord;
  }

  // Short circuit if reading the entire data edge.
  assert(current_leaf_ != nullptr);
  if (n == current_leaf_->length) {
    bytes_remaining_ = 0;
    current_chunk_ = {};
    CordRep* tree = CordRep::Ref(current_leaf_);
    subcord.contents_.EmplaceTree(VerifyTree(tree), method);
    return subcord;
  }

  // From this point on, we need a partial substring node.
  // Get pointer to the underlying flat or external data payload and
  // compute data pointer and offset into current flat or external.
  CordRep* payload = current_leaf_->IsSubstring()
                         ? current_leaf_->substring()->child
                         : current_leaf_;
  const char* data = payload->IsExternal() ? payload->external()->base
                                           : payload->flat()->Data();
  const size_t offset = static_cast<size_t>(current_chunk_.data() - data);

  auto* tree = CordRepSubstring::Substring(payload, offset, n);
  subcord.contents_.EmplaceTree(VerifyTree(tree), method);
  bytes_remaining_ -= n;
  current_chunk_.remove_prefix(n);
  return subcord;
}